

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatLabel
                (String *sb,FormatFlags formatFlags,BaseEmitter *emitter,uint32_t labelId)

{
  CodeHolder *pCVar1;
  Error EVar2;
  ulong uVar3;
  long lVar4;
  Error unaff_EBP;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  
  if ((emitter == (BaseEmitter *)0x0) || (pCVar1 = emitter->_code, pCVar1 == (CodeHolder *)0x0))
  goto LAB_0011ee83;
  if (labelId < *(uint *)&pCVar1->field_0x100) {
    lVar5 = *(long *)(*(long *)&pCVar1->_labelEntries + (ulong)labelId * 8);
  }
  else {
    lVar5 = 0;
  }
  if (lVar5 == 0) {
    bVar7 = false;
    unaff_EBP = String::_opFormat(sb,kAppend,"<InvalidLabel:%u>",(ulong)labelId);
  }
  else if (*(int *)(lVar5 + 0x30) == 0) {
    bVar7 = true;
  }
  else {
    uVar3 = (ulong)*(uint *)(lVar5 + 0x14);
    if (uVar3 == 0xffffffff) {
LAB_0011ee4a:
      if (*(char *)(lVar5 + 0x10) == '\0') {
        bVar7 = false;
        unaff_EBP = String::_opFormat(sb,kAppend,"L%u@",(ulong)labelId);
        if (unaff_EBP != 0) goto LAB_0011ee7e;
      }
      if (*(uint *)(lVar5 + 0x30) < 0xc) {
        pcVar6 = (char *)(lVar5 + 0x34);
      }
      else {
        pcVar6 = *(char **)(lVar5 + 0x38);
      }
      unaff_EBP = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
    }
    else {
      if (*(uint *)(lVar5 + 0x14) < *(uint *)&pCVar1->field_0x100) {
        lVar4 = *(long *)(*(long *)&pCVar1->_labelEntries + uVar3 * 8);
      }
      else {
        lVar4 = 0;
      }
      if (lVar4 == 0) {
        pcVar6 = "<InvalidLabel:%u>";
        uVar3 = (ulong)labelId;
LAB_0011ee1d:
        bVar7 = false;
        unaff_EBP = String::_opFormat(sb,kAppend,pcVar6,uVar3);
        if (unaff_EBP == 0) {
LAB_0011ee2a:
          EVar2 = String::_opChar(sb,kAppend,'.');
          bVar7 = EVar2 == 0;
          if (!bVar7) {
            unaff_EBP = EVar2;
          }
        }
      }
      else {
        if (*(uint *)(lVar4 + 0x30) == 0) {
          pcVar6 = "L%u";
          goto LAB_0011ee1d;
        }
        if (*(uint *)(lVar4 + 0x30) < 0xc) {
          pcVar6 = (char *)(lVar4 + 0x34);
        }
        else {
          pcVar6 = *(char **)(lVar4 + 0x38);
        }
        unaff_EBP = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
        if (unaff_EBP == 0) goto LAB_0011ee2a;
        bVar7 = false;
      }
      if (bVar7) goto LAB_0011ee4a;
    }
    bVar7 = false;
  }
LAB_0011ee7e:
  if (!bVar7) {
    return unaff_EBP;
  }
LAB_0011ee83:
  EVar2 = String::_opFormat(sb,kAppend,"L%u",(ulong)labelId);
  return EVar2;
}

Assistant:

Error formatLabel(
  String& sb,
  FormatFlags formatFlags,
  const BaseEmitter* emitter,
  uint32_t labelId) noexcept {

  DebugUtils::unused(formatFlags);

  if (emitter && emitter->code()) {
    const LabelEntry* le = emitter->code()->labelEntry(labelId);
    if (ASMJIT_UNLIKELY(!le))
      return sb.appendFormat("<InvalidLabel:%u>", labelId);

    if (le->hasName()) {
      if (le->hasParent()) {
        uint32_t parentId = le->parentId();
        const LabelEntry* pe = emitter->code()->labelEntry(parentId);

        if (ASMJIT_UNLIKELY(!pe))
          ASMJIT_PROPAGATE(sb.appendFormat("<InvalidLabel:%u>", labelId));
        else if (ASMJIT_UNLIKELY(!pe->hasName()))
          ASMJIT_PROPAGATE(sb.appendFormat("L%u", parentId));
        else
          ASMJIT_PROPAGATE(sb.append(pe->name()));

        ASMJIT_PROPAGATE(sb.append('.'));
      }

      if (le->type() == LabelType::kAnonymous)
        ASMJIT_PROPAGATE(sb.appendFormat("L%u@", labelId));
      return sb.append(le->name());
    }
  }

  return sb.appendFormat("L%u", labelId);
}